

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,throw_statement *s)

{
  expression *e;
  value local_70;
  value local_48;
  throw_statement *local_20;
  throw_statement *s_local;
  impl *this_local;
  
  local_20 = s;
  s_local = (throw_statement *)this;
  this_local = (impl *)__return_storage_ptr__;
  e = throw_statement::e(s);
  eval(&local_70,this,e);
  get_value(&local_48,this,&local_70);
  completion::completion(__return_storage_ptr__,&local_48,throw_);
  value::~value(&local_48);
  value::~value(&local_70);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const throw_statement& s) {
        return completion{get_value(eval(s.e())), completion_type::throw_};
    }